

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::destroy_range
               (NameIndex *S,NameIndex *E)

{
  NameIndex *this;
  undefined1 *__ptr;
  SmallVectorStorage<char,_8U> *pSVar1;
  
  if (E != S) {
    pSVar1 = &E[-1].Hdr.AugmentationString.super_SmallVector<char,_8U>.
              super_SmallVectorStorage<char,_8U>;
    do {
      __ptr = (undefined1 *)
              (((SmallVector<char,_8U> *)(pSVar1 + -2))->super_SmallVectorImpl<char>).
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX;
      if (pSVar1 != (SmallVectorStorage<char,_8U> *)__ptr) {
        free(__ptr);
      }
      this = (NameIndex *)(pSVar1 + -10);
      DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
      ::~DenseMap((DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                   *)this);
      pSVar1 = pSVar1 + -0x13;
    } while (this != S);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }